

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O1

void __thiscall
Assimp::SplitByBoneCountProcess::SplitMesh
          (SplitByBoneCountProcess *this,aiMesh *pMesh,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *poNewMeshes)

{
  pointer pvVar1;
  aiColor4D *paVar2;
  uint uVar3;
  aiBone *paVar4;
  iterator __position;
  aiVector3D *paVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer puVar22;
  pointer puVar23;
  char *pcVar24;
  vector<aiMesh*,std::allocator<aiMesh*>> *this_00;
  pointer ppVar25;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var26;
  aiMesh *paVar27;
  size_t sVar28;
  aiVector3D *paVar29;
  void *pvVar30;
  aiColor4D *paVar31;
  ulong *puVar32;
  aiFace *paVar33;
  uint *puVar34;
  aiBone **ppaVar35;
  aiBone *paVar36;
  aiVertexWeight *paVar37;
  aiFace *paVar38;
  uint uVar39;
  ulong uVar40;
  uint c;
  uint uVar41;
  ulong uVar42;
  uint a;
  ulong uVar43;
  long lVar44;
  aiMesh *newMesh;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newBonesAtCurrentFace;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subMeshFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mappedBoneIndex;
  vector<bool,_std::allocator<bool>_> isBoneUsed;
  vector<bool,_std::allocator<bool>_> isFaceHandled;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  vertexBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> previousVertexIndices;
  uint local_2ac;
  aiMesh *local_2a8;
  uint local_2a0;
  allocator_type local_299;
  uint *local_298;
  iterator iStack_290;
  uint *local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  uint local_260;
  value_type_conflict4 local_25c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  ulong local_238;
  vector<bool,_std::allocator<bool>_> local_230;
  vector<bool,_std::allocator<bool>_> local_208;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_1e0;
  char *local_1c8;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_1c0;
  SplitByBoneCountProcess *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  pointer local_198;
  ios_base local_138 [264];
  
  if (this->mMaxBoneCount < (ulong)pMesh->mNumBones) {
    local_1c0 = (vector<aiMesh*,std::allocator<aiMesh*>> *)poNewMeshes;
    local_1b8 = this;
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector(&local_1e0,(ulong)pMesh->mNumVertices,(allocator_type *)local_1a8);
    if (pMesh->mNumBones != 0) {
      uVar43 = 0;
      do {
        paVar4 = pMesh->mBones[uVar43];
        if (paVar4->mNumWeights != 0) {
          uVar42 = 0;
          do {
            local_1a8._0_4_ = (undefined4)uVar43;
            local_1a8._4_4_ = paVar4->mWeights[uVar42].mWeight;
            std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
            ::emplace_back<std::pair<unsigned_int,float>>
                      ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                        *)(local_1e0.
                           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                          paVar4->mWeights[uVar42].mVertexId),(pair<unsigned_int,_float> *)local_1a8
                      );
            uVar42 = uVar42 + 1;
          } while (uVar42 < paVar4->mNumWeights);
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 < pMesh->mNumBones);
    }
    local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_208,(ulong)pMesh->mNumFaces,(bool *)local_1a8,(allocator_type *)&local_230);
    if (pMesh->mNumFaces != 0) {
      local_1c8 = (pMesh->mName).data;
      local_260 = 0;
      do {
        local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_230,(ulong)pMesh->mNumBones,(bool *)local_1a8,(allocator_type *)&local_258
                  );
        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (uint *)0x0;
        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&local_278,(ulong)pMesh->mNumFaces);
        local_298 = (uint *)0x0;
        iStack_290._M_current = (uint *)0x0;
        local_288 = (uint *)0x0;
        local_1a8._0_4_ = 0;
        if (pMesh->mNumFaces == 0) {
          local_2ac = 0;
          local_2a0 = 0;
        }
        else {
          local_2a0 = 0;
          local_2ac = 0;
          uVar43 = 0;
          do {
            if ((local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar43 >> 6] >>
                 (uVar43 & 0x3f) & 1) == 0) {
              paVar33 = pMesh->mFaces + uVar43;
              if (pMesh->mFaces[uVar43].mNumIndices != 0) {
                uVar43 = 0;
                do {
                  uVar39 = paVar33->mIndices[uVar43];
                  ppVar25 = local_1e0.
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar39].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (local_1e0.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar39].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != ppVar25) {
                    pvVar1 = local_1e0.
                             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar39;
                    uVar42 = 0;
                    uVar40 = 1;
                    do {
                      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_ = ppVar25[uVar42].first;
                      if (((local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [(uint)local_258.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 6] >>
                            ((ulong)(uint)local_258.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start & 0x3f) & 1) ==
                           0) && (_Var26 = std::
                                           __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                                     (local_298,iStack_290._M_current,
                                                      (allocator_type *)&local_258),
                                 _Var26._M_current == iStack_290._M_current)) {
                        if (iStack_290._M_current == local_288) {
                          std::vector<unsigned_int,std::allocator<unsigned_int>>::
                          _M_realloc_insert<unsigned_int_const&>
                                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_298
                                     ,iStack_290,(uint *)&local_258);
                        }
                        else {
                          *iStack_290._M_current =
                               (uint)local_258.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          iStack_290._M_current = iStack_290._M_current + 1;
                        }
                      }
                      ppVar25 = (pvVar1->
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      bVar6 = uVar40 < (ulong)((long)(pvVar1->
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppVar25 >> 3);
                      uVar42 = uVar40;
                      uVar40 = (ulong)((int)uVar40 + 1);
                    } while (bVar6);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 < paVar33->mNumIndices);
              }
              if (((long)iStack_290._M_current - (long)local_298 >> 2) + (ulong)local_2a0 <=
                  local_1b8->mMaxBoneCount) {
                while (local_298 != iStack_290._M_current) {
                  uVar39 = iStack_290._M_current[-1];
                  iStack_290._M_current = iStack_290._M_current + -1;
                  if ((local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar39 >> 6]
                       >> ((ulong)uVar39 & 0x3f) & 1) == 0) {
                    local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar39 >> 6] =
                         local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar39 >> 6] | 1L << ((byte)uVar39 & 0x3f);
                    local_2a0 = local_2a0 + 1;
                  }
                }
                if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278,
                             (iterator)
                             local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)local_1a8);
                }
                else {
                  *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = local_1a8._0_4_;
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_2ac = local_2ac + paVar33->mNumIndices;
                local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [(uint)local_1a8._0_4_ >> 6] =
                     local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(uint)local_1a8._0_4_ >> 6] | 1L << ((byte)local_1a8._0_4_ & 0x3f);
                local_260 = local_260 + 1;
              }
            }
            local_1a8._0_4_ = local_1a8._0_4_ + 1;
            uVar43 = (ulong)(uint)local_1a8._0_4_;
          } while ((uint)local_1a8._0_4_ < pMesh->mNumFaces);
        }
        paVar27 = (aiMesh *)operator_new(0x520);
        paVar27->mPrimitiveTypes = 0;
        paVar27->mNumVertices = 0;
        paVar27->mNumFaces = 0;
        memset(&paVar27->mVertices,0,0xcc);
        paVar27->mBones = (aiBone **)0x0;
        paVar27->mMaterialIndex = 0;
        (paVar27->mName).length = 0;
        (paVar27->mName).data[0] = '\0';
        memset((paVar27->mName).data + 1,0x1b,0x3ff);
        this_00 = local_1c0;
        paVar27->mNumAnimMeshes = 0;
        paVar27->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar27->mMethod = 0;
        (paVar27->mAABB).mMin.x = 0.0;
        (paVar27->mAABB).mMin.y = 0.0;
        (paVar27->mAABB).mMin.z = 0.0;
        (paVar27->mAABB).mMax.x = 0.0;
        (paVar27->mAABB).mMax.y = 0.0;
        (paVar27->mAABB).mMax.z = 0.0;
        paVar27->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar27->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar27->mNumUVComponents[0] = 0;
        paVar27->mNumUVComponents[1] = 0;
        paVar27->mNumUVComponents[2] = 0;
        paVar27->mNumUVComponents[3] = 0;
        paVar27->mNumUVComponents[4] = 0;
        paVar27->mNumUVComponents[5] = 0;
        paVar27->mNumUVComponents[6] = 0;
        paVar27->mNumUVComponents[7] = 0;
        paVar27->mColors[0] = (aiColor4D *)0x0;
        paVar27->mColors[1] = (aiColor4D *)0x0;
        paVar27->mColors[2] = (aiColor4D *)0x0;
        paVar27->mColors[3] = (aiColor4D *)0x0;
        paVar27->mColors[4] = (aiColor4D *)0x0;
        paVar27->mColors[5] = (aiColor4D *)0x0;
        paVar27->mColors[6] = (aiColor4D *)0x0;
        paVar27->mColors[7] = (aiColor4D *)0x0;
        local_2a8 = paVar27;
        if ((pMesh->mName).length != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          pcVar24 = local_1c8;
          sVar28 = strlen(local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar24,sVar28);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_sub",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          puVar22 = local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish < &DAT_00000400) {
            (paVar27->mName).length =
                 (ai_uint32)
                 local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            memcpy((paVar27->mName).data,
                   (void *)CONCAT44(local_258.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_258.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start),
                   (size_t)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
            (paVar27->mName).data[(long)puVar22] = '\0';
          }
          if ((pointer *)
              CONCAT44(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (uint)local_258.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) !=
              &local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete((undefined1 *)
                            CONCAT44(local_258.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint)local_258.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start),
                            (long)local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        local_2a8->mMaterialIndex = pMesh->mMaterialIndex;
        local_2a8->mPrimitiveTypes = pMesh->mPrimitiveTypes;
        __position._M_current = *(aiMesh ***)(this_00 + 8);
        if (__position._M_current == *(aiMesh ***)(this_00 + 0x10)) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    (this_00,__position,&local_2a8);
        }
        else {
          *__position._M_current = local_2a8;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        paVar27 = local_2a8;
        local_2a8->mNumVertices = local_2ac;
        local_2a8->mNumFaces =
             (uint)((ulong)((long)local_278.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
        uVar43 = (ulong)local_2a8->mNumVertices;
        paVar29 = (aiVector3D *)operator_new__(uVar43 * 0xc);
        if (uVar43 != 0) {
          memset(paVar29,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar27->mVertices = paVar29;
        if ((pMesh->mNormals != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
          uVar43 = (ulong)paVar27->mNumVertices;
          paVar29 = (aiVector3D *)operator_new__(uVar43 * 0xc);
          if (uVar43 != 0) {
            memset(paVar29,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar27->mNormals = paVar29;
        }
        if (((pMesh->mTangents != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0))
           && (pMesh->mNumVertices != 0)) {
          uVar43 = (ulong)paVar27->mNumVertices;
          paVar29 = (aiVector3D *)operator_new__(uVar43 * 0xc);
          if (uVar43 != 0) {
            memset(paVar29,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar27->mTangents = paVar29;
          uVar43 = (ulong)paVar27->mNumVertices;
          paVar29 = (aiVector3D *)operator_new__(uVar43 * 0xc);
          if (uVar43 != 0) {
            memset(paVar29,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar27->mBitangents = paVar29;
        }
        lVar44 = 0;
        do {
          paVar27 = local_2a8;
          if ((*(long *)((long)pMesh->mTextureCoords + lVar44 * 2) != 0) &&
             (pMesh->mNumVertices != 0)) {
            uVar43 = (ulong)local_2a8->mNumVertices;
            pvVar30 = operator_new__(uVar43 * 0xc);
            if (uVar43 != 0) {
              memset(pvVar30,0,((uVar43 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            *(void **)((long)paVar27->mTextureCoords + lVar44 * 2) = pvVar30;
          }
          *(undefined4 *)((long)local_2a8->mNumUVComponents + lVar44) =
               *(undefined4 *)((long)pMesh->mNumUVComponents + lVar44);
          lVar44 = lVar44 + 4;
        } while (lVar44 != 0x20);
        lVar44 = 0;
        do {
          paVar27 = local_2a8;
          if ((pMesh->mColors[lVar44] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
            uVar39 = local_2a8->mNumVertices;
            uVar43 = (ulong)uVar39 << 4;
            paVar31 = (aiColor4D *)operator_new__(uVar43);
            if ((ulong)uVar39 != 0) {
              memset(paVar31,0,uVar43);
            }
            paVar27->mColors[lVar44] = paVar31;
          }
          puVar23 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar22 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar44 = lVar44 + 1;
        } while (lVar44 != 8);
        uVar43 = (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        puVar32 = (ulong *)operator_new__(-(ulong)(uVar43 >> 0x3c != 0) |
                                          ((long)local_278.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_278.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start) * 4 + 8U)
        ;
        *puVar32 = uVar43;
        paVar33 = (aiFace *)(puVar32 + 1);
        if (puVar23 != puVar22) {
          paVar38 = paVar33;
          do {
            paVar38->mNumIndices = 0;
            paVar38->mIndices = (uint *)0x0;
            paVar38 = paVar38 + 1;
          } while (paVar38 != paVar33 + uVar43);
        }
        local_2a8->mFaces = paVar33;
        uVar43 = (ulong)local_2ac;
        local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8,uVar43,
                   (value_type_conflict4 *)&local_258,(allocator_type *)&local_25c);
        local_238 = uVar43;
        if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar39 = 0;
        }
        else {
          uVar43 = 0;
          uVar39 = 0;
          do {
            paVar33 = pMesh->mFaces;
            uVar41 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar43];
            paVar38 = local_2a8->mFaces;
            uVar3 = paVar33[uVar41].mNumIndices;
            paVar38[uVar43].mNumIndices = uVar3;
            local_1b0 = uVar43;
            puVar34 = (uint *)operator_new__((ulong)uVar3 << 2);
            paVar38 = paVar38 + uVar43;
            paVar38->mIndices = puVar34;
            if (paVar38->mNumIndices != 0) {
              uVar43 = 0;
              do {
                uVar3 = paVar33[uVar41].mIndices[uVar43];
                paVar38->mIndices[uVar43] = uVar39;
                uVar42 = (ulong)uVar39;
                *(uint *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + uVar42 * 4) = uVar3;
                paVar29 = pMesh->mVertices;
                paVar5 = local_2a8->mVertices;
                paVar5[uVar42].z = paVar29[uVar3].z;
                paVar29 = paVar29 + uVar3;
                fVar7 = paVar29->y;
                paVar5 = paVar5 + uVar42;
                paVar5->x = paVar29->x;
                paVar5->y = fVar7;
                paVar29 = pMesh->mNormals;
                if ((paVar29 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                  paVar5 = local_2a8->mNormals;
                  paVar5[uVar42].z = paVar29[uVar3].z;
                  fVar7 = paVar29[uVar3].y;
                  paVar5 = paVar5 + uVar42;
                  paVar5->x = paVar29[uVar3].x;
                  paVar5->y = fVar7;
                }
                paVar29 = pMesh->mTangents;
                if (((paVar29 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
                   (pMesh->mNumVertices != 0)) {
                  paVar5 = local_2a8->mTangents;
                  paVar5[uVar42].z = paVar29[uVar3].z;
                  fVar7 = paVar29[uVar3].y;
                  paVar5 = paVar5 + uVar42;
                  paVar5->x = paVar29[uVar3].x;
                  paVar5->y = fVar7;
                  paVar29 = pMesh->mBitangents;
                  paVar5 = local_2a8->mBitangents;
                  paVar5[uVar42].z = paVar29[uVar3].z;
                  paVar29 = paVar29 + uVar3;
                  fVar7 = paVar29->y;
                  paVar5 = paVar5 + uVar42;
                  paVar5->x = paVar29->x;
                  paVar5->y = fVar7;
                }
                lVar44 = 0;
                do {
                  if ((pMesh->mTextureCoords[lVar44] != (aiVector3D *)0x0) &&
                     (pMesh->mNumVertices != 0)) {
                    paVar29 = pMesh->mTextureCoords[lVar44];
                    paVar5 = local_2a8->mTextureCoords[lVar44];
                    paVar5[uVar42].z = paVar29[uVar3].z;
                    paVar29 = paVar29 + uVar3;
                    fVar7 = paVar29->y;
                    paVar5 = paVar5 + uVar42;
                    paVar5->x = paVar29->x;
                    paVar5->y = fVar7;
                  }
                  lVar44 = lVar44 + 1;
                } while (lVar44 != 8);
                lVar44 = 0;
                do {
                  if ((pMesh->mColors[lVar44] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                    paVar31 = pMesh->mColors[lVar44] + uVar3;
                    fVar7 = paVar31->g;
                    fVar8 = paVar31->b;
                    fVar9 = paVar31->a;
                    paVar2 = local_2a8->mColors[lVar44] + uVar42;
                    paVar2->r = paVar31->r;
                    paVar2->g = fVar7;
                    paVar2->b = fVar8;
                    paVar2->a = fVar9;
                  }
                  lVar44 = lVar44 + 1;
                } while (lVar44 != 8);
                uVar39 = uVar39 + 1;
                uVar43 = uVar43 + 1;
              } while (uVar43 < paVar38->mNumIndices);
            }
            uVar43 = (ulong)((int)local_1b0 + 1);
          } while (uVar43 < (ulong)((long)local_278.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_278.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        paVar27 = local_2a8;
        if (uVar39 != local_2ac) {
          __assert_fail("nvi == numSubMeshVertices",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/SplitByBoneCountProcess.cpp"
                        ,0x135,
                        "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                       );
        }
        local_2a8->mNumBones = 0;
        ppaVar35 = (aiBone **)operator_new__((ulong)local_2a0 << 3);
        uVar43 = local_238;
        paVar27->mBones = ppaVar35;
        local_25c = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_258,(ulong)pMesh->mNumBones,&local_25c,&local_299);
        if (pMesh->mNumBones != 0) {
          uVar42 = 0;
          do {
            if ((local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar42 >> 6] >>
                 (uVar42 & 0x3f) & 1) != 0) {
              paVar4 = pMesh->mBones[uVar42];
              paVar36 = (aiBone *)operator_new(0x450);
              (paVar36->mName).length = 0;
              (paVar36->mName).data[0] = '\0';
              memset((paVar36->mName).data + 1,0x1b,0x3ff);
              paVar36->mNumWeights = 0;
              paVar36->mWeights = (aiVertexWeight *)0x0;
              (paVar36->mOffsetMatrix).a1 = 1.0;
              (paVar36->mOffsetMatrix).a2 = 0.0;
              (paVar36->mOffsetMatrix).a3 = 0.0;
              (paVar36->mOffsetMatrix).a4 = 0.0;
              (paVar36->mOffsetMatrix).b1 = 0.0;
              (paVar36->mOffsetMatrix).b2 = 1.0;
              (paVar36->mOffsetMatrix).b3 = 0.0;
              (paVar36->mOffsetMatrix).b4 = 0.0;
              (paVar36->mOffsetMatrix).c1 = 0.0;
              (paVar36->mOffsetMatrix).c2 = 0.0;
              (paVar36->mOffsetMatrix).c3 = 1.0;
              (paVar36->mOffsetMatrix).c4 = 0.0;
              (paVar36->mOffsetMatrix).d1 = 0.0;
              (paVar36->mOffsetMatrix).d2 = 0.0;
              (paVar36->mOffsetMatrix).d3 = 0.0;
              (paVar36->mOffsetMatrix).d4 = 1.0;
              *(uint *)(CONCAT44(local_258.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_258.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) + uVar42 * 4) =
                   local_2a8->mNumBones;
              uVar39 = local_2a8->mNumBones;
              local_2a8->mNumBones = uVar39 + 1;
              local_2a8->mBones[uVar39] = paVar36;
              if (paVar36 != paVar4) {
                uVar39 = (paVar4->mName).length;
                (paVar36->mName).length = uVar39;
                memcpy((paVar36->mName).data,(paVar4->mName).data,(ulong)uVar39);
                (paVar36->mName).data[uVar39] = '\0';
              }
              fVar18 = (paVar4->mOffsetMatrix).a1;
              fVar19 = (paVar4->mOffsetMatrix).a2;
              fVar20 = (paVar4->mOffsetMatrix).a3;
              fVar21 = (paVar4->mOffsetMatrix).a4;
              fVar14 = (paVar4->mOffsetMatrix).b1;
              fVar15 = (paVar4->mOffsetMatrix).b2;
              fVar16 = (paVar4->mOffsetMatrix).b3;
              fVar17 = (paVar4->mOffsetMatrix).b4;
              fVar10 = (paVar4->mOffsetMatrix).c1;
              fVar11 = (paVar4->mOffsetMatrix).c2;
              fVar12 = (paVar4->mOffsetMatrix).c3;
              fVar13 = (paVar4->mOffsetMatrix).c4;
              fVar7 = (paVar4->mOffsetMatrix).d2;
              fVar8 = (paVar4->mOffsetMatrix).d3;
              fVar9 = (paVar4->mOffsetMatrix).d4;
              (paVar36->mOffsetMatrix).d1 = (paVar4->mOffsetMatrix).d1;
              (paVar36->mOffsetMatrix).d2 = fVar7;
              (paVar36->mOffsetMatrix).d3 = fVar8;
              (paVar36->mOffsetMatrix).d4 = fVar9;
              (paVar36->mOffsetMatrix).c1 = fVar10;
              (paVar36->mOffsetMatrix).c2 = fVar11;
              (paVar36->mOffsetMatrix).c3 = fVar12;
              (paVar36->mOffsetMatrix).c4 = fVar13;
              (paVar36->mOffsetMatrix).b1 = fVar14;
              (paVar36->mOffsetMatrix).b2 = fVar15;
              (paVar36->mOffsetMatrix).b3 = fVar16;
              (paVar36->mOffsetMatrix).b4 = fVar17;
              (paVar36->mOffsetMatrix).a1 = fVar18;
              (paVar36->mOffsetMatrix).a2 = fVar19;
              (paVar36->mOffsetMatrix).a3 = fVar20;
              (paVar36->mOffsetMatrix).a4 = fVar21;
              paVar36->mNumWeights = 0;
              uVar43 = local_238;
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 < pMesh->mNumBones);
        }
        paVar27 = local_2a8;
        if (local_2a8->mNumBones != local_2a0) {
          __assert_fail("newMesh->mNumBones == numBones",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/SplitByBoneCountProcess.cpp"
                        ,0x14b,
                        "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                       );
        }
        if (local_2ac != 0) {
          uVar42 = 0;
          do {
            uVar39 = *(uint *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + uVar42 * 4);
            ppVar25 = local_1e0.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar39].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_1e0.
                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar39].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != ppVar25) {
              uVar41 = 1;
              uVar40 = 0;
              do {
                uVar40 = (ulong)*(uint *)(CONCAT44(local_258.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_258.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                         (ulong)ppVar25[uVar40].first * 4);
                if (uVar40 != 0xffffffff) {
                  puVar34 = &local_2a8->mBones[uVar40]->mNumWeights;
                  *puVar34 = *puVar34 + 1;
                }
                uVar40 = (ulong)uVar41;
                ppVar25 = local_1e0.
                          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar39].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar41 = uVar41 + 1;
              } while (uVar40 < (ulong)((long)local_1e0.
                                              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppVar25 >> 3));
            }
            uVar42 = uVar42 + 1;
          } while (uVar42 != uVar43);
        }
        if (local_2a8->mNumBones != 0) {
          lVar44 = 0;
          do {
            paVar4 = paVar27->mBones[lVar44];
            if ((ulong)paVar4->mNumWeights == 0) {
              __assert_fail("bone->mNumWeights > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/SplitByBoneCountProcess.cpp"
                            ,0x15f,
                            "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                           );
            }
            uVar43 = (ulong)paVar4->mNumWeights << 3;
            paVar37 = (aiVertexWeight *)operator_new__(uVar43);
            memset(paVar37,0,uVar43);
            paVar4->mWeights = paVar37;
            paVar4->mNumWeights = 0;
            lVar44 = lVar44 + 1;
          } while ((uint)lVar44 < paVar27->mNumBones);
        }
        if (local_2ac != 0) {
          uVar43 = 0;
          do {
            uVar39 = *(uint *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + uVar43 * 4);
            ppVar25 = local_1e0.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar39].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_1e0.
                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar39].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != ppVar25) {
              pvVar1 = local_1e0.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar39;
              uVar39 = 1;
              uVar42 = 0;
              do {
                uVar40 = (ulong)*(uint *)(CONCAT44(local_258.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_258.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                         (ulong)ppVar25[uVar42].first * 4);
                if (uVar40 == 0xffffffff) {
                  __assert_fail("newBoneIndex != std::numeric_limits<unsigned int>::max()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/SplitByBoneCountProcess.cpp"
                                ,0x170,
                                "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                               );
                }
                paVar4 = local_2a8->mBones[uVar40];
                paVar37 = paVar4->mWeights;
                uVar41 = paVar4->mNumWeights;
                paVar4->mNumWeights = uVar41 + 1;
                paVar37[uVar41].mVertexId = (uint)uVar43;
                paVar37[uVar41].mWeight =
                     (pvVar1->
                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar42].second;
                uVar42 = (ulong)uVar39;
                ppVar25 = (pvVar1->
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar39 = uVar39 + 1;
              } while (uVar42 < (ulong)((long)(pvVar1->
                                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppVar25 >> 3));
            }
            uVar43 = uVar43 + 1;
          } while (uVar43 != local_238);
        }
        pvVar30 = (void *)CONCAT44(local_258.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_258.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if (pvVar30 != (void *)0x0) {
          operator_delete(pvVar30,(long)local_258.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar30);
        }
        pvVar30 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
        if (pvVar30 != (void *)0x0) {
          operator_delete(pvVar30,(long)local_198 - (long)pvVar30);
        }
        if (local_298 != (uint *)0x0) {
          operator_delete(local_298,(long)local_288 - (long)local_298);
        }
        if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_278.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
      } while (local_260 < pMesh->mNumFaces);
    }
    if (local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_208.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector(&local_1e0);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::SplitMesh( const aiMesh* pMesh, std::vector<aiMesh*>& poNewMeshes) const
{
    // skip if not necessary
    if( pMesh->mNumBones <= mMaxBoneCount )
        return;

    // necessary optimisation: build a list of all affecting bones for each vertex
    // TODO: (thom) maybe add a custom allocator here to avoid allocating tens of thousands of small arrays
    typedef std::pair<unsigned int, float> BoneWeight;
    std::vector< std::vector<BoneWeight> > vertexBones( pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumBones; ++a)
    {
        const aiBone* bone = pMesh->mBones[a];
        for( unsigned int b = 0; b < bone->mNumWeights; ++b)
            vertexBones[ bone->mWeights[b].mVertexId ].push_back( BoneWeight( a, bone->mWeights[b].mWeight));
    }

    unsigned int numFacesHandled = 0;
    std::vector<bool> isFaceHandled( pMesh->mNumFaces, false);
    while( numFacesHandled < pMesh->mNumFaces )
    {
        // which bones are used in the current submesh
        unsigned int numBones = 0;
        std::vector<bool> isBoneUsed( pMesh->mNumBones, false);
        // indices of the faces which are going to go into this submesh
        std::vector<unsigned int> subMeshFaces;
        subMeshFaces.reserve( pMesh->mNumFaces);
        // accumulated vertex count of all the faces in this submesh
        unsigned int numSubMeshVertices = 0;
        // a small local array of new bones for the current face. State of all used bones for that face
        // can only be updated AFTER the face is completely analysed. Thanks to imre for the fix.
        std::vector<unsigned int> newBonesAtCurrentFace;

        // add faces to the new submesh as long as all bones affecting the faces' vertices fit in the limit
        for( unsigned int a = 0; a < pMesh->mNumFaces; ++a)
        {
            // skip if the face is already stored in a submesh
            if( isFaceHandled[a] )
                continue;

            const aiFace& face = pMesh->mFaces[a];
            // check every vertex if its bones would still fit into the current submesh
            for( unsigned int b = 0; b < face.mNumIndices; ++b )
            {
                const std::vector<BoneWeight>& vb = vertexBones[face.mIndices[b]];
                for( unsigned int c = 0; c < vb.size(); ++c)
                {
                    unsigned int boneIndex = vb[c].first;
                    // if the bone is already used in this submesh, it's ok
                    if( isBoneUsed[boneIndex] )
                        continue;

                    // if it's not used, yet, we would need to add it. Store its bone index
                    if( std::find( newBonesAtCurrentFace.begin(), newBonesAtCurrentFace.end(), boneIndex) == newBonesAtCurrentFace.end() )
                        newBonesAtCurrentFace.push_back( boneIndex);
                }
            }

            // leave out the face if the new bones required for this face don't fit the bone count limit anymore
            if( numBones + newBonesAtCurrentFace.size() > mMaxBoneCount )
                continue;

            // mark all new bones as necessary
            while( !newBonesAtCurrentFace.empty() )
            {
                unsigned int newIndex = newBonesAtCurrentFace.back();
                newBonesAtCurrentFace.pop_back(); // this also avoids the deallocation which comes with a clear()
                if( isBoneUsed[newIndex] )
                    continue;

                isBoneUsed[newIndex] = true;
                numBones++;
            }

            // store the face index and the vertex count
            subMeshFaces.push_back( a);
            numSubMeshVertices += face.mNumIndices;

            // remember that this face is handled
            isFaceHandled[a] = true;
            numFacesHandled++;
        }

        // create a new mesh to hold this subset of the source mesh
        aiMesh* newMesh = new aiMesh;
        if( pMesh->mName.length > 0 )
            newMesh->mName.Set( format() << pMesh->mName.data << "_sub" << poNewMeshes.size());
        newMesh->mMaterialIndex = pMesh->mMaterialIndex;
        newMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;
        poNewMeshes.push_back( newMesh);

        // create all the arrays for this mesh if the old mesh contained them
        newMesh->mNumVertices = numSubMeshVertices;
        newMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
        newMesh->mVertices = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasNormals() )
            newMesh->mNormals = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasTangentsAndBitangents() )
        {
            newMesh->mTangents = new aiVector3D[newMesh->mNumVertices];
            newMesh->mBitangents = new aiVector3D[newMesh->mNumVertices];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( pMesh->HasTextureCoords( a) )
                newMesh->mTextureCoords[a] = new aiVector3D[newMesh->mNumVertices];
            newMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( pMesh->HasVertexColors( a) )
                newMesh->mColors[a] = new aiColor4D[newMesh->mNumVertices];
        }

        // and copy over the data, generating faces with linear indices along the way
        newMesh->mFaces = new aiFace[subMeshFaces.size()];
        unsigned int nvi = 0; // next vertex index
        std::vector<unsigned int> previousVertexIndices( numSubMeshVertices, std::numeric_limits<unsigned int>::max()); // per new vertex: its index in the source mesh
        for( unsigned int a = 0; a < subMeshFaces.size(); ++a )
        {
            const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
            aiFace& dstFace = newMesh->mFaces[a];
            dstFace.mNumIndices = srcFace.mNumIndices;
            dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

            // accumulate linearly all the vertices of the source face
            for( unsigned int b = 0; b < dstFace.mNumIndices; ++b )
            {
                unsigned int srcIndex = srcFace.mIndices[b];
                dstFace.mIndices[b] = nvi;
                previousVertexIndices[nvi] = srcIndex;

                newMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
                if( pMesh->HasNormals() )
                    newMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
                if( pMesh->HasTangentsAndBitangents() )
                {
                    newMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
                    newMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++c )
                {
                    if( pMesh->HasTextureCoords( c) )
                        newMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c )
                {
                    if( pMesh->HasVertexColors( c) )
                        newMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
                }

                nvi++;
            }
        }

        ai_assert( nvi == numSubMeshVertices );

        // Create the bones for the new submesh: first create the bone array
        newMesh->mNumBones = 0;
        newMesh->mBones = new aiBone*[numBones];

        std::vector<unsigned int> mappedBoneIndex( pMesh->mNumBones, std::numeric_limits<unsigned int>::max());
        for( unsigned int a = 0; a < pMesh->mNumBones; ++a )
        {
            if( !isBoneUsed[a] )
                continue;

            // create the new bone
            const aiBone* srcBone = pMesh->mBones[a];
            aiBone* dstBone = new aiBone;
            mappedBoneIndex[a] = newMesh->mNumBones;
            newMesh->mBones[newMesh->mNumBones++] = dstBone;
            dstBone->mName = srcBone->mName;
            dstBone->mOffsetMatrix = srcBone->mOffsetMatrix;
            dstBone->mNumWeights = 0;
        }

        ai_assert( newMesh->mNumBones == numBones );

        // iterate over all new vertices and count which bones affected its old vertex in the source mesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a )
        {
            unsigned int oldIndex = previousVertexIndices[a];
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[oldIndex];

            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b )
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                if( newBoneIndex != std::numeric_limits<unsigned int>::max() )
                    newMesh->mBones[newBoneIndex]->mNumWeights++;
            }
        }

        // allocate all bone weight arrays accordingly
        for( unsigned int a = 0; a < newMesh->mNumBones; ++a )
        {
            aiBone* bone = newMesh->mBones[a];
            ai_assert( bone->mNumWeights > 0 );
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            bone->mNumWeights = 0; // for counting up in the next step
        }

        // now copy all the bone vertex weights for all the vertices which made it into the new submesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a)
        {
            // find the source vertex for it in the source mesh
            unsigned int previousIndex = previousVertexIndices[a];
            // these bones were affecting it
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[previousIndex];
            // all of the bones affecting it should be present in the new submesh, or else
            // the face it comprises shouldn't be present
            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b)
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                ai_assert( newBoneIndex != std::numeric_limits<unsigned int>::max() );
                aiVertexWeight* dstWeight = newMesh->mBones[newBoneIndex]->mWeights + newMesh->mBones[newBoneIndex]->mNumWeights;
                newMesh->mBones[newBoneIndex]->mNumWeights++;

                dstWeight->mVertexId = a;
                dstWeight->mWeight = bonesOnThisVertex[b].second;
            }
        }

        // I have the strange feeling that this will break apart at some point in time...
    }
}